

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O1

void x86SatisfyJumps(FastVector<unsigned_char_*,_false,_false> *instPos)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uchar **ppuVar8;
  
  if (pendingJumps.count != 0) {
    lVar3 = 8;
    uVar4 = 0;
    do {
      pcVar2 = *(char **)((long)&(pendingJumps.data)->labelID + lVar3);
      cVar1 = *pcVar2;
      uVar5 = *(uint *)((long)pendingJumps.data + lVar3 + -8);
      uVar7 = (ulong)uVar5;
      if (*(char *)((long)pendingJumps.data + lVar3 + -4) == '\x01') {
        uVar5 = uVar5 & 0xffffff;
        uVar7 = (ulong)uVar5;
        if (cVar1 == '\x0f') {
          if (instPos->count <= uVar5) goto LAB_001c550c;
          iVar6 = (*(int *)(instPos->data + uVar7) - (int)pcVar2) + -6;
LAB_001c54cf:
          *(int *)(pcVar2 + 2) = iVar6;
        }
        else {
          if (cVar1 == -0x73) {
            if (instPos->count <= uVar5) goto LAB_001c550c;
            ppuVar8 = instPos->data;
            goto LAB_001c54b6;
          }
          if (cVar1 == -0x18) {
            if (instPos->count <= uVar5) goto LAB_001c550c;
            ppuVar8 = instPos->data;
          }
          else {
            if (instPos->count <= uVar5) goto LAB_001c550c;
            ppuVar8 = instPos->data;
          }
LAB_001c54de:
          *(int *)(pcVar2 + 1) = (*(int *)(ppuVar8 + uVar7) - (int)pcVar2) + -5;
        }
      }
      else {
        if (cVar1 == -0x73) {
          ppuVar8 = labels.data;
          if (labels.count <= uVar5) goto LAB_001c550c;
LAB_001c54b6:
          iVar6 = *(int *)(ppuVar8 + uVar7);
          goto LAB_001c54cf;
        }
        if (cVar1 == -0x18) {
          ppuVar8 = labels.data;
          if (labels.count <= uVar5) goto LAB_001c550c;
          goto LAB_001c54de;
        }
        if (labels.count <= uVar5) {
LAB_001c550c:
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x7f,
                        "T &FastVector<unsigned char *>::operator[](unsigned int) [T = unsigned char *, zeroNewMemory = false, skipConstructor = false]"
                       );
        }
        if (0x7f < (long)pcVar2 - (long)labels.data[uVar7]) {
          __assert_fail("uJmp.jmpPos - labels[uJmp.labelID] + 128 < 256",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                        ,0x964,"void x86SatisfyJumps(FastVector<unsigned char *> &)");
        }
        pcVar2[1] = ((char)labels.data[uVar7] - (char)pcVar2) + -2;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (uVar4 < pendingJumps.count);
  }
  pendingJumps.count = 0;
  return;
}

Assistant:

void x86SatisfyJumps(FastVector<unsigned char*>& instPos)
{
	for(unsigned int i = 0; i < pendingJumps.size(); i++)
	{
		UnsatisfiedJump& uJmp = pendingJumps[i];
		if(uJmp.isNear)
		{
			if(*uJmp.jmpPos == 0xe8)
			{
				// This one is for call label
				int value = (int)(instPos[uJmp.labelID & 0x00ffffff] - uJmp.jmpPos-5);
				memcpy(uJmp.jmpPos + 1, &value, sizeof(value));
			}
			else if(*uJmp.jmpPos == 0x8d)
			{
				// This one is for lea reg, [label+offset]
				int value = (int)(intptr_t)(instPos[uJmp.labelID & 0x00ffffff]);
				memcpy(uJmp.jmpPos + 2, &value, sizeof(value));
			}
			else
			{
				if(*uJmp.jmpPos == 0x0f)
				{
					int value = (int)(instPos[uJmp.labelID & 0x00ffffff] - uJmp.jmpPos-6);
					memcpy(uJmp.jmpPos + 2, &value, sizeof(value));
				}
				else
				{
					int value = (int)(instPos[uJmp.labelID & 0x00ffffff] - uJmp.jmpPos-5);
					memcpy(uJmp.jmpPos + 1, &value, sizeof(value));
				}
			}
		}
		else
		{
			if(*uJmp.jmpPos == 0xe8)
			{
				// This one is for call label
				int value = (int)(labels[uJmp.labelID] - uJmp.jmpPos-5);
				memcpy(uJmp.jmpPos + 1, &value, sizeof(value));
			}
			else if(*uJmp.jmpPos == 0x8d)
			{
				// This one is for lea reg, [label+offset]
				int value = (int)(intptr_t)(labels[uJmp.labelID]);
				memcpy(uJmp.jmpPos + 2, &value, sizeof(value));
			}
			else
			{
				assert(uJmp.jmpPos - labels[uJmp.labelID] + 128 < 256);
				*(char*)(uJmp.jmpPos+1) = (char)(labels[uJmp.labelID] - uJmp.jmpPos-2);
			}
		}
	}
	pendingJumps.clear();
}